

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DisableConstraintSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DisableConstraintSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  size_t index_local;
  DisableConstraintSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->disable).kind;
    token._2_1_ = (this->disable).field_0x2;
    token.numFlags.raw = (this->disable).numFlags.raw;
    token.rawLen = (this->disable).rawLen;
    token.info = (this->disable).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->soft).kind;
    token_00._2_1_ = (this->soft).field_0x2;
    token_00.numFlags.raw = (this->soft).numFlags.raw;
    token_00.rawLen = (this->soft).rawLen;
    token_00.info = (this->soft).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->name);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DisableConstraintSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return disable;
        case 1: return soft;
        case 2: return name.get();
        case 3: return semi;
        default: return nullptr;
    }
}